

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGen::AppendFilenameSuffix_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename,string_view suffix)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  cmQtAutoGen *pcVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  char *local_28;
  size_t local_20;
  cmQtAutoGen *local_18;
  char *local_10;
  
  local_20 = suffix._M_len;
  local_28 = filename._M_str;
  local_38._M_str = (char *)filename._M_len;
  if (this == (cmQtAutoGen *)0x0) {
LAB_00503630:
    sVar4 = 2;
    local_38._M_len = (size_t)this;
  }
  else {
    pcVar5 = (cmQtAutoGen *)0x0;
    pcVar3 = local_38._M_str + (long)this;
    do {
      if (this == pcVar5) goto LAB_00503630;
      pcVar1 = pcVar3 + -1;
      pcVar5 = pcVar5 + 1;
      pcVar2 = pcVar3 + -1;
      pcVar3 = pcVar1;
    } while (*pcVar2 != '.');
    local_38._M_len = (size_t)(this + -(long)pcVar5);
    sVar4 = 3;
    local_18 = pcVar5;
    local_10 = pcVar1;
  }
  views._M_len = sVar4;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::AppendFilenameSuffix(cm::string_view filename,
                                              cm::string_view suffix)
{
  auto dotPos = filename.rfind('.');
  if (dotPos == cm::string_view::npos) {
    return cmStrCat(filename, suffix);
  }
  return cmStrCat(filename.substr(0, dotPos), suffix,
                  filename.substr(dotPos, filename.size() - dotPos));
}